

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O0

int Abc_ResCheckNonStrict(char *Pattern,int nVars,int nBits)

{
  int iVar1;
  int local_30;
  int Result;
  int nNumber;
  int nPats1;
  int nPats0;
  int m;
  int v;
  int nBits_local;
  int nVars_local;
  char *Pattern_local;
  
  local_30 = 0;
  nPats0 = 0;
  do {
    if (nVars <= nPats0) {
      return local_30;
    }
    Result = 0;
    nNumber = 0;
    for (nPats1 = 0; nPats1 < 1 << ((byte)nVars & 0x1f); nPats1 = nPats1 + 1) {
      if ((nPats1 & 1 << ((byte)nPats0 & 0x1f)) == 0) {
        iVar1 = Abc_ResCheckUnique(Abc_ResCheckNonStrict::Pat0,nNumber,(int)Pattern[nPats1]);
        if (iVar1 != 0) {
          iVar1 = nNumber + 1;
          Abc_ResCheckNonStrict::Pat0[nNumber] = Pattern[nPats1];
          nNumber = iVar1;
joined_r0x00279248:
          if (1 << ((char)nBits - 1U & 0x1f) < iVar1) break;
        }
      }
      else {
        iVar1 = Abc_ResCheckUnique(Abc_ResCheckNonStrict::Pat1,Result,(int)Pattern[nPats1]);
        if (iVar1 != 0) {
          iVar1 = Result + 1;
          Abc_ResCheckNonStrict::Pat1[Result] = Pattern[nPats1];
          Result = iVar1;
          goto joined_r0x00279248;
        }
      }
    }
    if (nPats1 == 1 << ((byte)nVars & 0x1f)) {
      local_30 = local_30 + 1;
    }
    nPats0 = nPats0 + 1;
  } while( true );
}

Assistant:

int Abc_ResCheckNonStrict( char Pattern[], int nVars, int nBits )
{
    static char Pat0[256], Pat1[256];
    int v, m, nPats0, nPats1, nNumber = (1 << (nBits - 1));
    int Result = 0;
    for ( v = 0; v < nVars; v++ )
    {
        nPats0 = nPats1 = 0;
        for ( m = 0; m < (1<<nVars); m++ )
        {
            if ( (m & (1 << v)) == 0 )
            {
                if ( Abc_ResCheckUnique( Pat0, nPats0, Pattern[m] ) )
                {
                    Pat0[ nPats0++ ] = Pattern[m];
                    if ( nPats0 > nNumber )
                        break;
                }
            }
            else
            {
                if ( Abc_ResCheckUnique( Pat1, nPats1, Pattern[m] ) )
                {
                    Pat1[ nPats1++ ] = Pattern[m];
                    if ( nPats1 > nNumber )
                        break;
                }
            }
        }
        if ( m == (1<<nVars) )
            Result++;
    }
    return Result;
}